

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O2

int __thiscall
CVmObjFile::getp_get_pos(CVmObjFile *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  long lVar2;
  undefined4 in_register_00000034;
  
  if (getp_get_pos(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar1 = __cxa_guard_acquire(&getp_get_pos(unsigned_int,vm_val_t*,unsigned_int*)::desc,
                                CONCAT44(in_register_00000034,self));
    if (iVar1 != 0) {
      getp_get_pos::desc.min_argc_ = 0;
      getp_get_pos::desc.opt_argc_ = 0;
      getp_get_pos::desc.varargs_ = 0;
      __cxa_guard_release(&getp_get_pos(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,argc,&getp_get_pos::desc);
  if (iVar1 == 0) {
    check_valid_file(this);
    lVar2 = get_pos(this);
    retval->typ = VM_INT;
    (retval->val).obj = (vm_obj_id_t)lVar2;
  }
  return 1;
}

Assistant:

int CVmObjFile::getp_get_pos(VMG_ vm_obj_id_t self, vm_val_t *retval,
                             uint *argc)
{
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* make sure we are allowed to perform operations on the file */
    check_valid_file(vmg0_);

    /* get the position */
    retval->set_int(get_pos(vmg0_));

    /* handled */
    return TRUE;
}